

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Attribute_PDU::Decode(Attribute_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  ushort uVar3;
  allocator<char> local_61;
  AttributeRecordSet local_60;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x1f < iVar2 + (uint)KVar1) {
    std::
    vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
    ::clear(&this->m_vAttributeRecordSets);
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_OrigSimAddr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_OrigSimAddr,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    KDataStream::Read(stream,&this->m_ui8ExtPDUType);
    KDataStream::Read(stream,&this->m_ui8ExtProtocolVersion);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32MasterRecType);
    KDataStream::Read(stream,&this->m_ui8ActionCode);
    KDataStream::Read(stream,&this->m_ui8Padding1);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumAttrRecSets);
    for (uVar3 = 0; uVar3 < this->m_ui16NumAttrRecSets; uVar3 = uVar3 + 1) {
      DATA_TYPE::AttributeRecordSet::AttributeRecordSet(&local_60,stream);
      std::
      vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
      ::emplace_back<KDIS::DATA_TYPE::AttributeRecordSet>(&this->m_vAttributeRecordSets,&local_60);
      DATA_TYPE::AttributeRecordSet::~AttributeRecordSet(&local_60);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Decode",&local_61);
  KException::KException(this_00,(KString *)&local_60,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Attribute_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ATTRIBUTE_PDU_SIZE  )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vAttributeRecordSets.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_OrigSimAddr
           >> m_ui32Padding
           >> m_ui16Padding
           >> m_ui8ExtPDUType
           >> m_ui8ExtProtocolVersion
           >> m_ui32MasterRecType
           >> m_ui8ActionCode
           >> m_ui8Padding1
           >> m_ui16NumAttrRecSets;

    for( KUINT16 i = 0; i < m_ui16NumAttrRecSets; ++i )
    {
        m_vAttributeRecordSets.push_back( AttributeRecordSet( stream ) );
    }
}